

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_manifold(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  REF_INT RVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  uint local_2020;
  REF_INT new_cell;
  REF_BOOL *local_2018;
  ulong local_2010;
  REF_GRID local_2008;
  REF_INT nnode1;
  REF_INT nnode0;
  int local_1ff8 [4];
  REF_INT nodes [27];
  REF_INT node_list1 [1000];
  REF_INT node_list0 [1000];
  
  *allowed = 0;
  pRVar1 = ref_grid->cell[8];
  local_2010 = (ulong)(uint)node1;
  uVar12 = 0xffffffff;
  RVar13 = -1;
  local_2018 = allowed;
  local_2008 = ref_grid;
  if (-1 < node1) {
    pRVar2 = pRVar1->ref_adj;
    uVar12 = 0xffffffff;
    RVar13 = -1;
    if (node1 < pRVar2->nnode) {
      uVar5 = pRVar2->first[local_2010];
      uVar12 = 0xffffffff;
      RVar13 = -1;
      if ((long)(int)uVar5 != -1) {
        RVar13 = pRVar2->item[(int)uVar5].ref;
        uVar12 = (ulong)uVar5;
      }
    }
  }
  while ((int)uVar12 != -1) {
    uVar5 = ref_cell_nodes(pRVar1,RVar13,nodes);
    if (uVar5 != 0) {
      pcVar15 = "nodes";
      uVar10 = 0x1c9;
      goto LAB_001abf80;
    }
    uVar5 = pRVar1->node_per;
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    bVar16 = false;
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      if (nodes[uVar6] == node0) {
        bVar16 = true;
      }
    }
    if (!bVar16) {
      for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
        if (nodes[lVar7] == node1) {
          nodes[lVar7] = node0;
        }
      }
      uVar5 = ref_cell_with(pRVar1,nodes,&new_cell);
      if ((uVar5 != 0) && (uVar5 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x1d4,"ref_collapse_edge_manifold",(ulong)uVar5);
        local_2020 = uVar5;
      }
      if ((uVar5 != 5) && (uVar5 != 0)) {
        return local_2020;
      }
      if (new_cell != -1) goto LAB_001ac27d;
    }
    pRVar3 = pRVar1->ref_adj->item;
    uVar12 = (ulong)pRVar3[(int)uVar12].next;
    RVar13 = -1;
    if (uVar12 != 0xffffffffffffffff) {
      RVar13 = pRVar3[uVar12].ref;
    }
  }
  pRVar1 = local_2008->cell[3];
  uVar12 = 0xffffffff;
  RVar13 = -1;
  if (-1 < node1) {
    pRVar2 = pRVar1->ref_adj;
    uVar12 = 0xffffffff;
    RVar13 = -1;
    if (node1 < pRVar2->nnode) {
      uVar5 = pRVar2->first[local_2010];
      RVar13 = -1;
      uVar12 = 0xffffffff;
      if ((long)(int)uVar5 != -1) {
        RVar13 = pRVar2->item[(int)uVar5].ref;
        uVar12 = (ulong)uVar5;
      }
    }
  }
  while ((int)uVar12 != -1) {
    uVar5 = ref_cell_nodes(pRVar1,RVar13,nodes);
    if (uVar5 != 0) {
      pcVar15 = "nodes";
      uVar10 = 0x1de;
      goto LAB_001abf80;
    }
    uVar5 = pRVar1->node_per;
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    bVar16 = false;
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      if (nodes[uVar6] == node0) {
        bVar16 = true;
      }
    }
    if (!bVar16) {
      for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
        if (nodes[lVar7] == node1) {
          nodes[lVar7] = node0;
          uVar5 = pRVar1->node_per;
        }
      }
      uVar5 = ref_cell_with(pRVar1,nodes,&new_cell);
      if ((uVar5 != 0) && (uVar5 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x1e9,"ref_collapse_edge_manifold",(ulong)uVar5);
        local_2020 = uVar5;
      }
      if ((uVar5 != 5) && (uVar5 != 0)) {
        return local_2020;
      }
      if (new_cell != -1) goto LAB_001ac27d;
    }
    RVar13 = -1;
    pRVar3 = pRVar1->ref_adj->item;
    uVar12 = (ulong)pRVar3[(int)uVar12].next;
    if (uVar12 != 0xffffffffffffffff) {
      RVar13 = pRVar3[uVar12].ref;
    }
  }
  pRVar1 = local_2008->cell[3];
  local_1ff8[0] = -1;
  local_1ff8[1] = 0xffffffff;
  local_1ff8[2] = 0xffffffff;
  local_1ff8[3] = 0xffffffff;
  uVar12 = 0xffffffff;
  RVar13 = -1;
  if (-1 < node1) {
    pRVar2 = pRVar1->ref_adj;
    uVar12 = 0xffffffff;
    RVar13 = -1;
    if (node1 < pRVar2->nnode) {
      uVar5 = pRVar2->first[local_2010];
      uVar12 = 0xffffffff;
      RVar13 = -1;
      if ((long)(int)uVar5 != -1) {
        RVar13 = pRVar2->item[(int)uVar5].ref;
        uVar12 = (ulong)uVar5;
      }
    }
  }
  uVar11 = 0;
  while ((int)uVar12 != -1) {
    uVar5 = ref_cell_nodes(pRVar1,RVar13,nodes);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x201,"ref_collapse_edge_manifold",(ulong)uVar5,"nodes");
      return uVar5;
    }
    uVar8 = 0;
    uVar6 = (ulong)(uint)pRVar1->node_per;
    if (pRVar1->node_per < 1) {
      uVar6 = uVar8;
    }
    bVar16 = false;
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      if (nodes[uVar8] == node0) {
        bVar16 = true;
      }
    }
    if (bVar16) {
      for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
        uVar9 = 0;
        uVar14 = 0;
        if (0 < (int)uVar11) {
          uVar14 = (ulong)uVar11;
        }
        bVar16 = false;
        for (; uVar14 != uVar9; uVar9 = uVar9 + 1) {
          bVar4 = !bVar16;
          bVar16 = true;
          if (bVar4) {
            bVar16 = nodes[uVar8] == local_1ff8[uVar9];
          }
        }
        if (!bVar16) {
          if (3 < (int)uVar11) {
            pcVar15 = "more than four remove tri nodes";
            uVar10 = 0x20d;
            goto LAB_001abfb3;
          }
          local_1ff8[(int)uVar11] = nodes[uVar8];
          uVar11 = uVar11 + 1;
        }
      }
    }
    pRVar3 = pRVar1->ref_adj->item;
    uVar12 = (ulong)pRVar3[(int)uVar12].next;
    RVar13 = -1;
    if (uVar12 != 0xffffffffffffffff) {
      RVar13 = pRVar3[uVar12].ref;
    }
  }
  if ((4 < uVar11) || ((0x19U >> (uVar11 & 0x1f) & 1) == 0)) {
    pcVar15 = "nsafe not 3-non manifold or 4-manifold";
    uVar10 = 0x215;
LAB_001abfb3:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar10,"ref_collapse_edge_manifold",pcVar15);
    return 1;
  }
  if (uVar11 - 3 < 2) {
    uVar5 = ref_cell_node_list_around(pRVar1,node0,1000,&nnode0,node_list0);
    if (uVar5 != 0) {
      pcVar15 = "node0 list";
      uVar10 = 0x21a;
      goto LAB_001abf80;
    }
    uVar5 = ref_cell_node_list_around(pRVar1,node1,1000,&nnode1,node_list1);
    if (uVar5 != 0) {
      pcVar15 = "node1 list";
      uVar10 = 0x21d;
      goto LAB_001abf80;
    }
    uVar6 = 0;
    uVar12 = (ulong)(uint)nnode1;
    if (nnode1 < 1) {
      uVar12 = uVar6;
    }
    uVar8 = (ulong)(uint)nnode0;
    if (nnode0 < 1) {
      uVar8 = uVar6;
    }
    for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
      for (uVar9 = 0; uVar9 != uVar12; uVar9 = uVar9 + 1) {
        if (node_list0[uVar6] == node_list1[uVar9]) {
          bVar16 = true;
          for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
            if (bVar16) {
              bVar16 = node_list0[uVar6] != local_1ff8[uVar14];
            }
            else {
              bVar16 = false;
            }
          }
          if (bVar16) goto LAB_001ac27d;
        }
      }
    }
  }
  pRVar1 = local_2008->cell[0];
  uVar12 = 0xffffffff;
  RVar13 = -1;
  if (-1 < node1) {
    pRVar2 = pRVar1->ref_adj;
    uVar12 = 0xffffffff;
    RVar13 = -1;
    if (node1 < pRVar2->nnode) {
      uVar5 = pRVar2->first[local_2010];
      uVar12 = 0xffffffff;
      RVar13 = -1;
      if ((long)(int)uVar5 != -1) {
        RVar13 = pRVar2->item[(int)uVar5].ref;
        uVar12 = (ulong)uVar5;
      }
    }
  }
  while( true ) {
    if ((int)uVar12 == -1) {
      *local_2018 = 1;
      return 0;
    }
    uVar5 = ref_cell_nodes(pRVar1,RVar13,nodes);
    if (uVar5 != 0) break;
    uVar5 = pRVar1->node_per;
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    bVar16 = false;
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      if (nodes[uVar6] == node0) {
        bVar16 = true;
      }
    }
    if (!bVar16) {
      for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
        if (nodes[lVar7] == node1) {
          nodes[lVar7] = node0;
          uVar5 = pRVar1->node_per;
        }
      }
      uVar5 = ref_cell_with(pRVar1,nodes,&new_cell);
      if ((uVar5 != 0) && (uVar5 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x23d,"ref_collapse_edge_manifold",(ulong)uVar5,"with node0 failed");
        local_2020 = uVar5;
      }
      if ((uVar5 != 5) && (uVar5 != 0)) {
        return local_2020;
      }
      if (new_cell != -1) {
LAB_001ac27d:
        *local_2018 = 0;
        return 0;
      }
    }
    pRVar3 = pRVar1->ref_adj->item;
    uVar12 = (ulong)pRVar3[(int)uVar12].next;
    RVar13 = -1;
    if (uVar12 != 0xffffffffffffffff) {
      RVar13 = pRVar3[uVar12].ref;
    }
  }
  pcVar15 = "nodes";
  uVar10 = 0x232;
LAB_001abf80:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar10
         ,"ref_collapse_edge_manifold",(ulong)uVar5,pcVar15);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_manifold(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1,
                                              REF_BOOL *allowed) {
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, new_cell;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  { /* ensure the tri node neighbors shared by node0 and node1 are
       involved in the collapse (i.e. there are no new connections to
       created) */
    REF_INT safe_list[4], nsafe;
    REF_INT nnode0, node_list0[MAX_NODE_LIST];
    REF_INT nnode1, node_list1[MAX_NODE_LIST];
    REF_INT i, i0, i1;
    REF_BOOL already_have_it, shared;

    nsafe = 0;
    safe_list[0] = REF_EMPTY;
    safe_list[1] = REF_EMPTY;
    safe_list[2] = REF_EMPTY;
    safe_list[3] = REF_EMPTY;
    each_ref_cell_having_node(ref_cell, node1, item, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

      will_be_collapsed = REF_FALSE;
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
      if (will_be_collapsed) {
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          already_have_it = REF_FALSE;
          for (i = 0; i < nsafe; i++) {
            already_have_it = already_have_it || (nodes[node] == safe_list[i]);
          }
          if (!already_have_it) {
            RAS(nsafe < 4, "more than four remove tri nodes");
            safe_list[nsafe] = nodes[node];
            nsafe++;
          }
        }
      }
    }
    RAS(0 == nsafe || 3 == nsafe || 4 == nsafe,
        "nsafe not 3-non manifold or 4-manifold");

    if (3 == nsafe || 4 == nsafe) {
      RSS(ref_cell_node_list_around(ref_cell, node0, MAX_NODE_LIST, &nnode0,
                                    node_list0),
          "node0 list");
      RSS(ref_cell_node_list_around(ref_cell, node1, MAX_NODE_LIST, &nnode1,
                                    node_list1),
          "node1 list");
      for (i0 = 0; i0 < nnode0; i0++) {
        for (i1 = 0; i1 < nnode1; i1++) {
          if (node_list0[i0] == node_list1[i1]) {
            shared = REF_TRUE;
            for (i = 0; i < nsafe; i++) {
              shared = shared && (node_list0[i0] != safe_list[i]);
            }
            if (shared) {
              *allowed = REF_FALSE;
              return REF_SUCCESS;
            }
          }
        }
      }
    }
  }

  ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}